

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.c
# Opt level: O0

void handle_request_only_finish(tester_t *tester,validator_mq_msg *msg)

{
  FILE *pFVar1;
  uint uVar2;
  uint *puVar3;
  int *piVar4;
  char *pcVar5;
  byte local_29;
  _Bool send_completed_1;
  _Bool send_completed;
  validator_mq_msg *msg_local;
  tester_t *tester_local;
  
  uVar2 = getpid();
  log_formatted("%d RCD: %s, completed=%d, finish=%d, for TESTER IN LIST: %d, bal=%d, completed=%d, expected_rcd=%d"
                ,(ulong)uVar2,msg->word,(ulong)(msg->completed & 1),(ulong)(msg->finish & 1),
                (ulong)(uint)tester->pid,tester->word_bal,(uint)(tester->completed & 1),tester->rcd)
  ;
  if ((msg->finish & 1U) == 0) {
    local_29 = 0;
    if (tester->word_bal == 0) {
      local_29 = tester->completed_sent ^ 0xff;
    }
    if ((_Bool)(local_29 & 1) != false) {
      tester->completed_sent = true;
    }
    async_send_to_tester(tester->pid,msg->word,(_Bool)(local_29 & 1),tester->rcd,true,false);
    pFVar1 = _stderr;
    if ((err & 1U) != 0) {
      puVar3 = (uint *)__errno_location();
      uVar2 = *puVar3;
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(pFVar1,"%s - error number: %d (%s)\n","Unable to ignore tester asynchronously",
              (ulong)uVar2,pcVar5);
      kill_all_exit();
    }
  }
  else {
    await_runs = await_runs - 1;
    tester->word_bal = tester->word_bal + -1;
    if ((msg->accepted & 1U) != 0) {
      comm_summary.acc = comm_summary.acc + 1;
      tester->acc = tester->acc + 1;
    }
    async_send_to_tester
              (tester->pid,msg->word,tester->word_bal == 0,tester->rcd,false,
               (_Bool)(msg->accepted & 1));
    pFVar1 = _stderr;
    if ((err & 1U) != 0) {
      puVar3 = (uint *)__errno_location();
      uVar2 = *puVar3;
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(pFVar1,"%s - error number: %d (%s)\n",
              "Unable to send response to tester asynchronously",(ulong)uVar2,pcVar5);
      kill_all_exit();
    }
  }
  return;
}

Assistant:

static void handle_request_only_finish(tester_t *tester, validator_mq_msg *msg) {
    assert(halt_flag_raised);
    assert(tester != NULL);
    assert(msg != NULL);
    assert(tester->pid == msg->tester_pid);
    assert(tester->word_bal >= 0);

    log_formatted("%d RCD: %s, completed=%d, finish=%d, for TESTER IN LIST: %d, bal=%d, completed=%d, expected_rcd=%d",
                  getpid(), msg->word, msg->completed, msg->finish,
                  tester->pid, tester->word_bal, tester->completed, tester->rcd);

    if(msg->finish) {
        assert(!msg->start);

        // update logs
        await_runs--;
        tester->word_bal--;
        if(msg->accepted) {
            comm_summary.acc++;
            tester->acc++;
        }
        // format and send response
        bool send_completed = (tester->word_bal == 0); // different condition because of raised halt flag
        async_send_to_tester(tester->pid, msg->word, send_completed, tester->rcd, false, msg->accepted);
        HANDLE_ERR_WITH_MSG(kill_all_exit, "Unable to send response to tester asynchronously");
    } else {
        // no matter what it is, it should be ignored.
        bool send_completed = (tester->word_bal == 0 && !tester->completed_sent); // different condition because of raised halt flag
        if(send_completed) {
            tester->completed_sent = true;
        }
        async_send_to_tester(tester->pid, msg->word, send_completed, tester->rcd, true, false);
        HANDLE_ERR_WITH_MSG(kill_all_exit, "Unable to ignore tester asynchronously");
    }
}